

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  UnitTestImpl *pUVar4;
  undefined8 extraout_RAX;
  allocator local_11d;
  int local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GTestLog::GTestLog((GTestLog *)&local_d0,GTEST_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest-death-test.cc"
                     ,0x339);
  Message::Message((Message *)&local_118);
  std::operator<<((ostream *)(local_118._M_dataplus._M_p + 0x10),
                  "Death tests use fork(), which is unsafe particularly");
  std::operator<<((ostream *)(local_118._M_dataplus._M_p + 0x10),
                  " in a threaded context. For this test, ");
  std::operator<<((ostream *)(local_118._M_dataplus._M_p + 0x10),"Google Test");
  std::operator<<((ostream *)(local_118._M_dataplus._M_p + 0x10)," ");
  std::operator<<((ostream *)(local_118._M_dataplus._M_p + 0x10),
                  "couldn\'t detect the number of threads.");
  StringStreamToString(&local_f8,(stringstream *)local_118._M_dataplus._M_p);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_118);
  std::operator<<((ostream *)&std::cerr,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  GTestLog::~GTestLog((GTestLog *)&local_d0);
  iVar1 = pipe(pipe_fd);
  if (iVar1 != -1) {
    std::__cxx11::string::string((string *)&local_f8,"",(allocator *)&local_118);
    DeathTest::set_last_death_test_message(&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 == -1) goto LAB_0012bdc1;
    *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var2;
    if (_Var2 == 0) goto LAB_0012bbf5;
    do {
      iVar1 = close(pipe_fd[1]);
      if (iVar1 != -1) {
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        return OVERSEE_TEST;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    std::__cxx11::string::string((string *)&local_b0,"CHECK failed: File ",&local_11d);
    std::operator+(&local_90,&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest-death-test.cc"
                  );
    std::operator+(&local_70,&local_90,", line ");
    local_11c = 0x35a;
    StreamableToString<int>(&local_30,&local_11c);
    std::operator+(&local_50,&local_70,&local_30);
    std::operator+(&local_d0,&local_50,": ");
    std::operator+(&local_118,&local_d0,"close(pipe_fd[1])");
    std::operator+(&local_f8,&local_118," != -1");
    DeathTestAbort(&local_f8);
    while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_0012bbf5:
      iVar1 = close(pipe_fd[0]);
      if (iVar1 != -1) {
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pipe_fd[1];
        pUVar4 = GetUnitTestImpl();
        ((pUVar4->listeners_).repeater_)->forwarding_enabled_ = false;
        g_in_fast_death_test_child = 1;
        return EXECUTE_TEST;
      }
    }
    std::__cxx11::string::string((string *)&local_b0,"CHECK failed: File ",&local_11d);
    std::operator+(&local_90,&local_b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest-death-test.cc"
                  );
    std::operator+(&local_70,&local_90,", line ");
    local_11c = 0x34e;
    StreamableToString<int>(&local_30,&local_11c);
    std::operator+(&local_50,&local_70,&local_30);
    std::operator+(&local_d0,&local_50,": ");
    std::operator+(&local_118,&local_d0,"close(pipe_fd[0])");
    std::operator+(&local_f8,&local_118," != -1");
    DeathTestAbort(&local_f8);
  }
  std::__cxx11::string::string((string *)&local_90,"CHECK failed: File ",(allocator *)&local_11c);
  std::operator+(&local_70,&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_50,&local_70,", line ");
  local_30._M_dataplus._M_p._0_4_ = 0x33d;
  StreamableToString<int>(&local_b0,(int *)&local_30);
  std::operator+(&local_d0,&local_50,&local_b0);
  std::operator+(&local_118,&local_d0,": ");
  std::operator+(&local_f8,&local_118,"pipe(pipe_fd) != -1");
  DeathTestAbort(&local_f8);
LAB_0012bdc1:
  std::__cxx11::string::string((string *)&local_90,"CHECK failed: File ",(allocator *)&local_11c);
  std::operator+(&local_70,&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/gtest-1.7.0/src/gtest-death-test.cc"
                );
  std::operator+(&local_50,&local_70,", line ");
  local_30._M_dataplus._M_p._0_4_ = 0x34b;
  StreamableToString<int>(&local_b0,(int *)&local_30);
  std::operator+(&local_d0,&local_50,&local_b0);
  std::operator+(&local_118,&local_d0,": ");
  std::operator+(&local_f8,&local_118,"child_pid != -1");
  DeathTestAbort(&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}